

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

void inter_predictor(uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,
                    SubpelParams *subpel_params,int w,int h,ConvolveParams *conv_params,
                    InterpFilterParams **interp_filters)

{
  int iVar1;
  undefined4 in_ECX;
  int unaff_EBP;
  int *in_R8;
  undefined4 in_R9D;
  InterpFilterParams **unaff_R15;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  ConvolveParams *in_stack_00000020;
  SubpelParams sp;
  int is_scaled;
  undefined8 local_68;
  undefined8 in_stack_ffffffffffffffa0;
  int iVar2;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 uVar3;
  undefined4 in_stack_ffffffffffffffc0;
  
  iVar2 = SUB84(in_stack_ffffffffffffffa0,4);
  iVar1 = has_scale(*in_R8,in_R8[1]);
  if (iVar1 == 0) {
    local_68._0_4_ = in_R8[0];
    local_68._4_4_ = in_R8[1];
    iVar2 = (int)((ulong)*(undefined8 *)(in_R8 + 2) >> 0x20);
    uVar3._0_4_ = in_R8[4];
    uVar3._4_4_ = in_R8[5];
    revert_scale_extra_bits((SubpelParams *)&local_68);
    av1_convolve_2d_facade
              ((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffc0),(int)((ulong)in_R8 >> 0x20),
               (uint8_t *)CONCAT44(in_R9D,iVar1),SUB84(uVar3,4),(int)uVar3,iVar2,unaff_R15,unaff_EBP
               ,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
               in_stack_00000020);
  }
  else {
    av1_convolve_2d_facade
              ((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffc0),(int)((ulong)in_R8 >> 0x20),
               (uint8_t *)CONCAT44(in_R9D,iVar1),SUB84(in_stack_ffffffffffffffa8,4),
               (int)in_stack_ffffffffffffffa8,iVar2,unaff_R15,unaff_EBP,unaff_retaddr,
               in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
  }
  return;
}

Assistant:

static inline void inter_predictor(
    const uint8_t *src, int src_stride, uint8_t *dst, int dst_stride,
    const SubpelParams *subpel_params, int w, int h,
    ConvolveParams *conv_params, const InterpFilterParams *interp_filters[2]) {
  assert(conv_params->do_average == 0 || conv_params->do_average == 1);
  const int is_scaled = has_scale(subpel_params->xs, subpel_params->ys);
  if (is_scaled) {
    av1_convolve_2d_facade(src, src_stride, dst, dst_stride, w, h,
                           interp_filters, subpel_params->subpel_x,
                           subpel_params->xs, subpel_params->subpel_y,
                           subpel_params->ys, 1, conv_params);
  } else {
    SubpelParams sp = *subpel_params;
    revert_scale_extra_bits(&sp);
    av1_convolve_2d_facade(src, src_stride, dst, dst_stride, w, h,
                           interp_filters, sp.subpel_x, sp.xs, sp.subpel_y,
                           sp.ys, 0, conv_params);
  }
}